

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,SectionNode *p)

{
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_18;
  
  if (p != (SectionNode *)0x0) {
    (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])(p)
    ;
  }
  local_18 = (Ptr<Catch::CumulativeReporterBase::SectionNode>)this->m_p;
  this->m_p = p;
  ~Ptr(&local_18);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }